

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer7_memfunc.cpp
# Opt level: O3

int main(void)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  service *psVar3;
  io_context io_context;
  Printer printer;
  io_context local_e8;
  error_code local_d8;
  system_error local_c8;
  Printer local_88;
  
  boost::asio::io_context::io_context(&local_e8);
  Printer::Printer(&local_88,&local_e8);
  boost::system::error_code::error_code(&local_d8);
  boost::asio::detail::scheduler::run(local_e8.impl_,&local_d8);
  if (local_d8.failed_ == true) {
    std::runtime_error::runtime_error(&local_c8.super_runtime_error,"");
    local_c8.m_what._M_dataplus._M_p = (pointer)((long)&local_c8 + 0x30);
    local_c8._0_8_ = &PTR__system_error_00124210;
    local_c8.m_error_code.cat_ = local_d8.cat_;
    local_c8.m_what._M_string_length = 0;
    local_c8.m_what.field_2._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>(&local_c8);
  }
  Printer::~Printer(&local_88);
  psVar3 = (local_e8.super_execution_context.service_registry_)->first_service_;
  eVar2.service_registry_ = local_e8.super_execution_context.service_registry_;
  if (psVar3 != (service *)0x0) {
    do {
      (*psVar3->_vptr_service[2])(psVar3);
      eVar2.service_registry_ = local_e8.super_execution_context.service_registry_;
      psVar3 = psVar3->next_;
    } while (psVar3 != (service *)0x0);
    psVar3 = (local_e8.super_execution_context.service_registry_)->first_service_;
    if (psVar3 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar3->_vptr_service;
        psVar3 = psVar3->next_;
        (*(*ppp_Var1)[1])();
        (eVar2.service_registry_)->first_service_ = psVar3;
      } while (psVar3 != (service *)0x0);
      eVar2.service_registry_ = local_e8.super_execution_context.service_registry_;
      if (local_e8.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar2.service_registry_ = (service_registry *)0x0;
        goto LAB_00116afd;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar2.service_registry_)->mutex_);
LAB_00116afd:
  operator_delete(eVar2.service_registry_);
  return 0;
}

Assistant:

int main() {
  boost::asio::io_context io_context;

  Printer printer{ io_context };

  io_context.run();

  return 0;
}